

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_large_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  int iVar3;
  int extraout_EAX_03;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr_00;
  char **ppcVar6;
  undefined8 *extraout_RDX;
  char *__s1;
  undefined4 uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  Byte **unaff_R12;
  uLong auStack_2f0 [2];
  undefined1 *puStack_2e0;
  char *pcStack_2d8;
  ulong uStack_2c8;
  undefined4 uStack_2c0;
  undefined4 uStack_2a8;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  uLong uStack_268;
  char *pcStack_258;
  undefined1 *puStack_250;
  code *pcStack_248;
  char *pcStack_240;
  int iStack_238;
  undefined1 *puStack_228;
  undefined4 uStack_220;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  uLong uStack_1e0;
  ulong uStack_1c8;
  code *pcStack_1c0;
  ulong uStack_1b8;
  uint uStack_1b0;
  undefined4 uStack_198;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  char *pcStack_148;
  ulong uStack_140;
  code *pcStack_138;
  char *pcStack_128;
  uint uStack_120;
  ulong uStack_110;
  undefined4 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  uLong uStack_b8;
  Byte **ppBStack_b0;
  uLong uStack_a8;
  code *pcStack_a0;
  Byte *local_90;
  undefined4 local_88;
  Byte *local_78;
  undefined4 local_70;
  ulong local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  local_88 = (undefined4)comprLen;
  pcVar8 = "1.2.11";
  pcStack_a0 = (code *)0x1031f4;
  local_90 = compr;
  iVar1 = inflateInit_(&local_90,"1.2.11",0x70);
  if (iVar1 == 0) {
    unaff_R12 = &local_90;
    do {
      local_70 = (undefined4)uncomprLen;
      pcVar8 = (char *)0x0;
      pcStack_a0 = (code *)0x103210;
      local_78 = uncompr;
      iVar1 = inflate(unaff_R12);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_a0 = (code *)0x103257;
      test_large_inflate_cold_4();
      goto LAB_00103257;
    }
    pcStack_a0 = (code *)0x103223;
    uVar2 = inflateEnd(&local_90);
    if (uVar2 != 0) goto LAB_0010325e;
    comprLen = comprLen >> 1;
    uVar12 = local_68;
    if (local_68 == comprLen + uncomprLen * 2) {
      pcStack_a0 = (code *)0x103244;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103257:
    pcStack_a0 = (code *)0x10325e;
    test_large_inflate_cold_1();
    uVar2 = extraout_EAX;
LAB_0010325e:
    uVar12 = (ulong)uVar2;
    pcStack_a0 = (code *)0x103265;
    test_large_inflate_cold_2();
  }
  pcStack_a0 = test_flush;
  test_large_inflate_cold_3();
  pcStack_138 = (code *)0x10328a;
  uStack_b8 = uncomprLen;
  ppBStack_b0 = unaff_R12;
  uStack_a8 = comprLen;
  pcStack_a0 = (code *)uncompr;
  sVar4 = strlen(hello);
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uVar9 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_138 = (code *)0x1032b7;
  iVar1 = deflateInit_(&pcStack_128,0xffffffff,"1.2.11");
  if (iVar1 == 0) {
    pcStack_128 = hello;
    uStack_120 = 3;
    uStack_108 = *(undefined4 *)pcVar8;
    uVar9 = 3;
    pcStack_138 = (code *)0x1032dd;
    uStack_110 = uVar12;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_0010332a;
    *(char *)(uVar12 + 3) = *(char *)(uVar12 + 3) + '\x01';
    uStack_120 = (int)sVar4 - 2;
    sVar4 = (size_t)uStack_120;
    uVar9 = 4;
    pcStack_138 = (code *)0x1032fc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103331;
    pcStack_138 = (code *)0x10330b;
    uVar2 = deflateEnd(&pcStack_128);
    if (uVar2 == 0) {
      *(undefined8 *)pcVar8 = uStack_100;
      return;
    }
  }
  else {
    pcStack_138 = (code *)0x10332a;
    test_flush_cold_1();
LAB_0010332a:
    pcStack_138 = (code *)0x103331;
    test_flush_cold_2();
LAB_00103331:
    pcStack_138 = (code *)0x103338;
    test_flush_cold_4();
    uVar2 = extraout_EAX_00;
  }
  uVar13 = (ulong)uVar2;
  pcStack_138 = test_sync;
  test_flush_cold_3();
  *extraout_RDX = 0x65676162726167;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  uStack_1b0 = 2;
  pcVar10 = "1.2.11";
  pcStack_1c0 = (code *)0x10338e;
  uStack_1b8 = uVar13;
  pcStack_148 = pcVar8;
  uStack_140 = uVar12;
  pcStack_138 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_1b8,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_198 = SUB84(ppcVar6,0);
    pcVar10 = (char *)0x0;
    pcStack_1c0 = (code *)0x1033a4;
    iVar1 = inflate();
    if (iVar1 != 0) goto LAB_001033fc;
    uStack_1b0 = (int)uVar9 - 2;
    uVar9 = (ulong)uStack_1b0;
    pcStack_1c0 = (code *)0x1033b8;
    iVar1 = inflateSync();
    if (iVar1 != 0) goto LAB_00103403;
    pcVar10 = (char *)0x4;
    pcStack_1c0 = (code *)0x1033c9;
    iVar1 = inflate(&uStack_1b8);
    if (iVar1 != -3) goto LAB_0010340a;
    pcStack_1c0 = (code *)0x1033d6;
    uVar2 = inflateEnd(&uStack_1b8);
    if (uVar2 == 0) {
      pcStack_1c0 = (code *)0x1033eb;
      printf("after inflateSync(): hel%s\n",extraout_RDX);
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x1033fc;
    test_sync_cold_1();
LAB_001033fc:
    pcStack_1c0 = (code *)0x103403;
    test_sync_cold_2();
LAB_00103403:
    pcStack_1c0 = (code *)0x10340a;
    test_sync_cold_3();
LAB_0010340a:
    pcStack_1c0 = (code *)0x10340f;
    test_sync_cold_4();
    uVar2 = extraout_EAX_01;
  }
  puVar14 = (ulong *)(ulong)uVar2;
  pcStack_1c0 = test_dict_deflate;
  test_sync_cold_5();
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uVar7 = 9;
  pcVar8 = (char *)0x70;
  pcStack_248 = (code *)0x10344d;
  uStack_1c8 = uVar9;
  pcStack_1c0 = (code *)ppcVar6;
  iVar1 = deflateInit_(&pcStack_240,9,"1.2.11");
  if (iVar1 == 0) {
    uVar7 = 0x104348;
    pcStack_248 = (code *)0x103465;
    iVar1 = deflateSetDictionary(&pcStack_240,"hello",6);
    if (iVar1 != 0) goto LAB_001034c3;
    dictId = uStack_1e0;
    uStack_220 = SUB84(pcVar10,0);
    pcStack_240 = hello;
    pcStack_248 = (code *)0x10348e;
    puStack_228 = (undefined1 *)puVar14;
    sVar4 = strlen(hello);
    iStack_238 = (int)sVar4 + 1;
    uVar7 = 4;
    pcStack_248 = (code *)0x1034a1;
    iVar1 = deflate(&pcStack_240);
    ppcVar6 = &pcStack_240;
    if (iVar1 != 1) goto LAB_001034ca;
    pcStack_248 = (code *)0x1034ae;
    uVar2 = deflateEnd(&pcStack_240);
    ppcVar6 = &pcStack_240;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_248 = (code *)0x1034c3;
    test_dict_deflate_cold_1();
LAB_001034c3:
    pcStack_248 = (code *)0x1034ca;
    test_dict_deflate_cold_2();
LAB_001034ca:
    pcStack_248 = (code *)0x1034cf;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_02;
  }
  uVar12 = (ulong)uVar2;
  pcStack_248 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_288 = 0;
  uStack_280 = 0;
  uStack_278 = 0;
  pcVar11 = "1.2.11";
  uStack_2c8 = uVar12;
  uStack_2c0 = uVar7;
  pcStack_258 = pcVar10;
  puStack_250 = (undefined1 *)puVar14;
  pcStack_248 = (code *)ppcVar6;
  iVar1 = inflateInit_(&uStack_2c8,"1.2.11",0x70);
  if (iVar1 == 0) {
    uStack_2a8 = SUB84(pcVar8,0);
    pcVar8 = "hello";
    do {
      pcVar11 = (char *)0x0;
      iVar1 = inflate(&uStack_2c8);
      if (iVar1 == 2) {
        if (uStack_268 != dictId) {
          test_dict_inflate_cold_2();
          puVar14 = &uStack_2c8;
          goto LAB_001035b6;
        }
        pcVar11 = "hello";
        iVar1 = inflateSetDictionary(&uStack_2c8,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_00103577;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_00103577:
    iVar1 = inflateEnd(&uStack_2c8);
    puVar14 = &uStack_2c8;
    if (iVar1 == 0) {
      pcVar11 = hello;
      pcVar10 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar10;
      puVar14 = &uStack_2c8;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_001035c4;
    }
  }
  else {
LAB_001035b6:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_03;
  }
  test_dict_inflate_cold_3();
LAB_001035c4:
  test_dict_inflate_cold_4();
  auStack_2f0[0] = 40000;
  puStack_2e0 = (undefined1 *)puVar14;
  pcStack_2d8 = pcVar8;
  pcVar8 = (char *)zlibVersion();
  if (*pcVar8 == '1') {
    pcVar8 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar8,"1.2.11");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.11",0x12b0,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar8 = "foo.gz";
      }
      else {
        pcVar8 = *(char **)(pcVar11 + 8);
      }
      test_gzio(pcVar8,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_2f0);
      test_sync(compr_00,auStack_2f0[0],uncompr_00,40000);
      auStack_2f0[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_large_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    for (;;) {
        d_stream.next_out = uncompr;            /* discard the output */
        d_stream.avail_out = (uInt)uncomprLen;
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "large inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (d_stream.total_out != 2*uncomprLen + comprLen/2) {
        fprintf(stderr, "bad large inflate: %ld\n", d_stream.total_out);
        exit(1);
    } else {
        printf("large_inflate(): OK\n");
    }
}